

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O1

int CBB_flush(CBB *cbb)

{
  CBB *cbb_00;
  size_t sVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint8_t *extraout_RAX;
  uint8_t *puVar5;
  anon_union_32_2_4f6aaa2e_for_u *paVar6;
  ulong uVar7;
  size_t len;
  uint8_t uVar8;
  ulong __n;
  ulong uVar9;
  cbb_buffer_st *base;
  
  base = (cbb_buffer_st *)&cbb->u;
  if (cbb->is_child != '\0') {
    base = ((cbb_child_st *)base)->base;
  }
  if (base == (cbb_buffer_st *)0x0) {
    return 0;
  }
  if ((base->field_0x18 & 2) != 0) {
    return 0;
  }
  cbb_00 = cbb->child;
  if (cbb_00 == (CBB *)0x0) {
    return 1;
  }
  if (cbb_00->is_child == '\0') {
    __assert_fail("cbb->child->is_child",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,0xc5,"int CBB_flush(CBB *)");
  }
  if ((cbb_buffer_st *)(cbb_00->u).base.buf != base) {
    __assert_fail("child->base == base",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,199,"int CBB_flush(CBB *)");
  }
  uVar9 = (ulong)(cbb_00->u).child.pending_len_len + (cbb_00->u).base.len;
  iVar3 = CBB_flush(cbb_00);
  if (((iVar3 != 0) && ((cbb_00->u).base.len <= uVar9)) &&
     (__n = base->len - uVar9, uVar9 <= base->len)) {
    if ((*(byte *)((long)&cbb_00->u + 0x11) & 1) != 0) {
      if ((cbb_00->u).child.pending_len_len != '\x01') {
        __assert_fail("child->pending_len_len == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                      ,0xd9,"int CBB_flush(CBB *)");
      }
      if (__n < 0xffffffff) {
        if (__n < 0x1000000) {
          if (0xffff < __n) {
            uVar8 = 0x83;
            len = 3;
            goto LAB_0046cd66;
          }
          if (0xff < __n) {
            uVar8 = 0x82;
            len = 2;
            goto LAB_0046cd66;
          }
          len = 0;
          if (0x7f < __n) {
            uVar8 = 0x81;
            len = 1;
            goto LAB_0046cd66;
          }
          uVar8 = (uint8_t)__n;
          bVar2 = true;
          __n = 0;
        }
        else {
          uVar8 = 0x84;
          len = 4;
LAB_0046cd66:
          bVar2 = false;
        }
        if (!bVar2) {
          bVar2 = false;
          uVar4 = cbb_buffer_reserve(base,(uint8_t **)0x0,len);
          if (uVar4 == 0) {
            bVar2 = true;
          }
          else {
            base->len = base->len + len;
            if (__n != 0) {
              memmove(base->buf + uVar9 + len,base->buf + uVar9,__n);
            }
          }
          puVar5 = (uint8_t *)(ulong)uVar4;
          if (uVar4 == 0) goto LAB_0046cde0;
        }
        puVar5 = base->buf;
        sVar1 = (cbb_00->u).base.len;
        (cbb_00->u).base.len = sVar1 + 1;
        puVar5[sVar1] = uVar8;
        (cbb_00->u).child.pending_len_len = (uint8_t)len;
        bVar2 = false;
      }
      else {
        ERR_put_error(0xe,0,0x45,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                      ,0xdc);
        bVar2 = true;
        puVar5 = extraout_RAX;
      }
LAB_0046cde0:
      if (bVar2) goto LAB_0046ce33;
      if (bVar2) {
        return (int)puVar5;
      }
    }
    uVar7 = (ulong)(cbb_00->u).child.pending_len_len;
    uVar9 = uVar7;
    while (uVar9 = uVar9 - 1, uVar9 < uVar7) {
      base->buf[uVar9 + (cbb_00->u).base.len] = (uint8_t)__n;
      __n = __n >> 8;
      uVar7 = (ulong)(cbb_00->u).child.pending_len_len;
    }
    if (__n == 0) {
      (cbb_00->u).base.buf = (uint8_t *)0x0;
      iVar3 = 1;
      goto LAB_0046ce46;
    }
    ERR_put_error(0xe,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,0x103);
  }
LAB_0046ce33:
  paVar6 = &cbb->u;
  if (cbb->is_child != '\0') {
    paVar6 = (anon_union_32_2_4f6aaa2e_for_u *)(paVar6->base).buf;
  }
  *(byte *)((long)paVar6 + 0x18) = *(byte *)((long)paVar6 + 0x18) | 2;
  iVar3 = 0;
LAB_0046ce46:
  cbb->child = (CBB *)0x0;
  return iVar3;
}

Assistant:

int CBB_flush(CBB *cbb) {
  // If |base| has hit an error, the buffer is in an undefined state, so
  // fail all following calls. In particular, |cbb->child| may point to invalid
  // memory.
  struct cbb_buffer_st *base = cbb_get_base(cbb);
  if (base == NULL || base->error) {
    return 0;
  }

  if (cbb->child == NULL) {
    // Nothing to flush.
    return 1;
  }

  assert(cbb->child->is_child);
  struct cbb_child_st *child = &cbb->child->u.child;
  assert(child->base == base);
  size_t child_start = child->offset + child->pending_len_len;

  size_t len;
  if (!CBB_flush(cbb->child) || child_start < child->offset ||
      base->len < child_start) {
    goto err;
  }

  len = base->len - child_start;

  if (child->pending_is_asn1) {
    // For ASN.1 we assume that we'll only need a single byte for the length.
    // If that turned out to be incorrect, we have to move the contents along
    // in order to make space.
    uint8_t len_len;
    uint8_t initial_length_byte;

    assert(child->pending_len_len == 1);

    if (len > 0xfffffffe) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
      // Too large.
      goto err;
    } else if (len > 0xffffff) {
      len_len = 5;
      initial_length_byte = 0x80 | 4;
    } else if (len > 0xffff) {
      len_len = 4;
      initial_length_byte = 0x80 | 3;
    } else if (len > 0xff) {
      len_len = 3;
      initial_length_byte = 0x80 | 2;
    } else if (len > 0x7f) {
      len_len = 2;
      initial_length_byte = 0x80 | 1;
    } else {
      len_len = 1;
      initial_length_byte = (uint8_t)len;
      len = 0;
    }

    if (len_len != 1) {
      // We need to move the contents along in order to make space.
      size_t extra_bytes = len_len - 1;
      if (!cbb_buffer_add(base, NULL, extra_bytes)) {
        goto err;
      }
      OPENSSL_memmove(base->buf + child_start + extra_bytes,
                      base->buf + child_start, len);
    }
    base->buf[child->offset++] = initial_length_byte;
    child->pending_len_len = len_len - 1;
  }

  for (size_t i = child->pending_len_len - 1; i < child->pending_len_len; i--) {
    base->buf[child->offset + i] = (uint8_t)len;
    len >>= 8;
  }
  if (len != 0) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
    goto err;
  }

  child->base = NULL;
  cbb->child = NULL;

  return 1;

err:
  cbb_on_error(cbb);
  return 0;
}